

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::auxiliary_vector
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  uint uVar1;
  pointer ppvVar2;
  vector<float,_std::allocator<float>_> *in_RAX;
  vector<float,_std::allocator<float>_> *local_28;
  
  local_28 = in_RAX;
  while( true ) {
    ppvVar2 = (this->aux_vecs).
              super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = this->num_aux_vecs;
    if ((ulong)uVar1 <
        (ulong)((long)(this->aux_vecs).
                      super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3)) break;
    local_28 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::
    vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
    ::emplace_back<std::vector<float,std::allocator<float>>*>
              ((vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
                *)&this->aux_vecs,&local_28);
  }
  this->num_aux_vecs = uVar1 + 1;
  return ppvVar2[uVar1];
}

Assistant:

std::vector<float>* AttentionalModel<Builder>::auxiliary_vector()
{
    while (num_aux_vecs >= aux_vecs.size())
        aux_vecs.push_back(new std::vector<float>());
    // NB, we return the last auxiliary vector, AND increment counter
    return aux_vecs[num_aux_vecs++]; 
}